

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xpath_node *
pugi::impl::(anonymous_namespace)::
min_element<pugi::xpath_node_const*,pugi::impl::(anonymous_namespace)::document_order_comparator>
          (xpath_node *begin,xpath_node *end,document_order_comparator *pred)

{
  bool bVar1;
  xpath_node *local_30;
  xpath_node *it;
  xpath_node *result;
  document_order_comparator *pred_local;
  xpath_node *end_local;
  xpath_node *begin_local;
  
  it = begin;
  for (local_30 = begin + 1; local_30 != end; local_30 = local_30 + 1) {
    bVar1 = anon_unknown_0::document_order_comparator::operator()(pred,local_30,it);
    if (bVar1) {
      it = local_30;
    }
  }
  return it;
}

Assistant:

PUGI__FN I min_element(I begin, I end, const Pred& pred)
	{
		I result = begin;

		for (I it = begin + 1; it != end; ++it)
			if (pred(*it, *result))
				result = it;

		return result;
	}